

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

Block * __thiscall
wasm::Builder::blockifyWithName
          (Builder *this,Expression *any,Name name,Expression *append,optional<wasm::Type> type)

{
  undefined1 auVar1 [12];
  Block *this_00;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  
  this_00 = (Block *)0x0;
  if ((any != (Expression *)0x0) && (any->_id == BlockId)) {
    this_00 = (Block *)any;
  }
  if ((this_00 == (Block *)0x0) || ((this_00->name).super_IString.str._M_str != (char *)0x0)) {
    this_00 = makeBlock(this,any);
    (this_00->name).super_IString.str._M_len = name.super_IString.str._M_len;
    (this_00->name).super_IString.str._M_str = name.super_IString.str._M_str;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)any;
    Block::finalize(this_00,type_,Unknown);
  }
  else {
    (this_00->name).super_IString.str._M_len = name.super_IString.str._M_len;
    (this_00->name).super_IString.str._M_str = name.super_IString.str._M_str;
  }
  if (append == (Expression *)0x0) {
    if (type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged != true) {
      return this_00;
    }
  }
  else {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,append);
  }
  auVar1 = type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._0_12_;
  type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)auVar1._0_8_;
  type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)auVar1[8];
  type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = auVar1._9_3_;
  Block::finalize(this_00,type__00,Unknown);
  return this_00;
}

Assistant:

Block* blockifyWithName(Expression* any,
                          Name name,
                          Expression* append = nullptr,
                          std::optional<Type> type = std::nullopt) {
    Block* block = nullptr;
    if (any) {
      block = any->dynCast<Block>();
    }
    if (!block || block->name.is()) {
      block = makeBlock(name, any);
    } else {
      block->name = name;
    }
    if (append) {
      block->list.push_back(append);
    }
    if (append || type) {
      block->finalize(type);
    }
    return block;
  }